

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::_InternalSerialize
          (CategoricalCrossEntropyLossLayer *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  string *psVar5;
  void *data;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  CategoricalCrossEntropyLossLayer *this_local;
  
  _internal_input_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar3 & 1) == 0) {
    _internal_input_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    _internal_input_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,"CoreML.Specification.CategoricalCrossEntropyLossLayer.input")
    ;
    psVar5 = _internal_input_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,psVar5,target);
  }
  _internal_target_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    _internal_target_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    _internal_target_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,"CoreML.Specification.CategoricalCrossEntropyLossLayer.target"
              );
    psVar5 = _internal_target_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,2,psVar5,(uint8_t *)stream_local);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar2 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar2,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* CategoricalCrossEntropyLossLayer::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // string input = 1;
  if (!this->_internal_input().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_input().data(), static_cast<int>(this->_internal_input().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CategoricalCrossEntropyLossLayer.input");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_input(), target);
  }

  // string target = 2;
  if (!this->_internal_target().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_target().data(), static_cast<int>(this->_internal_target().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CategoricalCrossEntropyLossLayer.target");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_target(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  return target;
}